

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPTP.cpp
# Opt level: O1

void __thiscall Parse::TPTP::addTagState(TPTP *this,Tag t)

{
  State *pSVar1;
  Tag *pTVar2;
  
  if ((this->_states)._cursor == (this->_states)._end) {
    ::Lib::Stack<Parse::TPTP::State>::expand(&this->_states);
  }
  pSVar1 = (this->_states)._cursor;
  *pSVar1 = TAG;
  (this->_states)._cursor = pSVar1 + 1;
  if ((this->_tags)._cursor == (this->_tags)._end) {
    ::Lib::Stack<Parse::TPTP::Tag>::expand(&this->_tags);
  }
  pTVar2 = (this->_tags)._cursor;
  *pTVar2 = t;
  (this->_tags)._cursor = pTVar2 + 1;
  return;
}

Assistant:

void TPTP::addTagState(Tag t)
{
  _states.push(TAG);
  _tags.push(t);
}